

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *
wasm::WATParser::anon_unknown_0::integer
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          string_view in)

{
  bool bVar1;
  size_t sVar2;
  Sign SVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  OverflowBehavior in_R8D;
  char *pcVar7;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view in_00;
  string_view in_01;
  undefined1 local_80 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  LexIntCtx ctx;
  
  pcVar5 = in._M_str;
  pcVar6 = (char *)in._M_len;
  ctx.super_LexCtx.input._M_str = (char *)0x0;
  sv._M_str = "+";
  sv._M_len = 1;
  lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
  _32_8_ = pcVar6;
  sVar2 = LexCtx::startsWith((LexCtx *)
                             &lexed.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                              ._M_engaged,sv);
  SVar3 = Pos;
  if (sVar2 == 0) {
    sv_00._M_str = "-";
    sv_00._M_len = 1;
    sVar2 = LexCtx::startsWith((LexCtx *)
                               &lexed.
                                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                ._M_payload.
                                super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                ._M_engaged,sv_00);
    SVar3 = Neg;
    if (sVar2 != 0) goto LAB_00b8f2e2;
    SVar3 = NoSign;
  }
  else {
LAB_00b8f2e2:
    ctx.super_LexCtx.input._M_str = (char *)0x1;
  }
  sv_01._M_str = "0x";
  sv_01._M_len = 2;
  sVar2 = LexCtx::startsWith((LexCtx *)
                             &lexed.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                              ._M_engaged,sv_01);
  if (sVar2 == 0) {
    if (pcVar6 < ctx.super_LexCtx.input._M_str) goto LAB_00b8f3cd;
    in_01._M_str = (char *)0x0;
    in_01._M_len = (size_t)(pcVar5 + (long)ctx.super_LexCtx.input._M_str);
    num((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_80,
        (anon_unknown_0 *)(pcVar6 + -(long)ctx.super_LexCtx.input._M_str),in_01,in_R8D);
  }
  else {
    ctx.super_LexCtx.input._M_str = ctx.super_LexCtx.input._M_str + 2;
    if (pcVar6 < ctx.super_LexCtx.input._M_str) {
LAB_00b8f3cd:
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 ctx.super_LexCtx.input._M_str,pcVar6);
    }
    in_00._M_str = (char *)0x0;
    in_00._M_len = (size_t)(pcVar5 + (long)ctx.super_LexCtx.input._M_str);
    hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_80,
           (anon_unknown_0 *)(pcVar6 + -(long)ctx.super_LexCtx.input._M_str),in_00,in_R8D);
  }
  if (lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_payload._M_value.sign._0_1_ == '\x01') {
    pcVar7 = ctx.super_LexCtx.input._M_str + (long)local_80;
    bVar1 = LexCtx::canFinish((LexCtx *)
                              &lexed.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                               ._M_engaged);
    if (bVar1) {
      if (pcVar7 == (char *)0x0) {
        bVar1 = false;
      }
      else {
        if (pcVar6 < pcVar7) {
          pcVar7 = pcVar6;
        }
        uVar4 = (char *)-(long)lexed.
                               super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                               ._M_payload.
                               super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                               ._M_payload._M_value.super_LexResult.span._M_str;
        if (SVar3 != Neg) {
          uVar4 = lexed.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                  ._M_payload.
                  super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                  ._M_payload._M_value.super_LexResult.span._M_str;
        }
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.super_LexResult.span._M_len = (size_t)pcVar7;
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.super_LexResult.span._M_str = pcVar5;
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.n = uVar4;
        (__return_storage_ptr__->
        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
        _M_payload.
        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
        _M_payload._M_value.sign = SVar3;
        bVar1 = true;
      }
      (__return_storage_ptr__->
      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
      _M_engaged = bVar1;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>)._M_payload
  .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>._M_engaged =
       false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexIntResult> integer(std::string_view in) {
  LexIntCtx ctx(in);
  ctx.takeSign();
  if (ctx.takePrefix("0x"sv)) {
    if (auto lexed = hexnum(ctx.next())) {
      ctx.take(*lexed);
      if (ctx.canFinish()) {
        return ctx.lexed();
      }
    }
    // TODO: Add error production for unrecognized hexnum.
    return {};
  }
  if (auto lexed = num(ctx.next())) {
    ctx.take(*lexed);
    if (ctx.canFinish()) {
      return ctx.lexed();
    }
  }
  return {};
}